

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib578.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  int local_24;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      local_24 = curl_easy_setopt(lVar2,0x2712,URL);
      if (((((local_24 == 0) && (local_24 = curl_easy_setopt(lVar2,0x2f,1), local_24 == 0)) &&
           (local_24 = curl_easy_setopt(lVar2,0x3c,data_size), local_24 == 0)) &&
          ((local_24 = curl_easy_setopt(lVar2,0x271f,data), local_24 == 0 &&
           (local_24 = curl_easy_setopt(lVar2,0x2b,0), local_24 == 0)))) &&
         ((local_24 = curl_easy_setopt(lVar2,0x4e58,progress_callback), local_24 == 0 &&
          ((local_24 = curl_easy_setopt(lVar2,0x29,1), local_24 == 0 &&
           (local_24 = curl_easy_setopt(lVar2,0x2a,1), local_24 == 0)))))) {
        local_24 = curl_easy_perform(lVar2);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      URL_local._4_4_ = local_24;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res=CURLE_OK;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Now specify we want to POST data */
  test_setopt(curl, CURLOPT_POST, 1L);

#ifdef CURL_DOES_CONVERSIONS
  /* Convert the POST data to ASCII */
  test_setopt(curl, CURLOPT_TRANSFERTEXT, 1L);
#endif

  /* Set the expected POST size */
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, data_size);
  test_setopt(curl, CURLOPT_POSTFIELDS, data);

  /* we want to use our own progress function */
  test_setopt(curl, CURLOPT_NOPROGRESS, 0L);
  test_setopt(curl, CURLOPT_PROGRESSFUNCTION, progress_callback);

  /* pointer to pass to our read function */

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}